

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

size_t __thiscall caffe::NetState::ByteSizeLong(NetState *this)

{
  void *pvVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Type *pTVar5;
  ulong uVar6;
  uint uVar7;
  int n;
  size_t sVar8;
  
  pvVar1 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) == 0) {
    sVar8 = 0;
  }
  else {
    sVar8 = google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize
                      ((UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  uVar4 = (this->stage_).super_RepeatedPtrFieldBase.current_size_;
  sVar8 = sVar8 + uVar4;
  if (0 < (int)uVar4) {
    uVar7 = 0;
    do {
      pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&(this->stage_).super_RepeatedPtrFieldBase,uVar7);
      uVar3 = (uint)pTVar5->_M_string_length | 1;
      iVar2 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar8 = sVar8 + pTVar5->_M_string_length + (ulong)(iVar2 * 9 + 0x49U >> 6);
      uVar7 = uVar7 + 1;
    } while (uVar4 != uVar7);
  }
  uVar4 = (this->_has_bits_).has_bits_[0];
  if ((uVar4 & 3) != 0) {
    if ((uVar4 & 1) != 0) {
      if (this->level_ < 0) {
        uVar6 = 0xb;
      }
      else {
        uVar7 = this->level_ | 1;
        iVar2 = 0x1f;
        if (uVar7 != 0) {
          for (; uVar7 >> iVar2 == 0; iVar2 = iVar2 + -1) {
          }
        }
        uVar6 = (ulong)((iVar2 * 9 + 0x49U >> 6) + 1);
      }
      sVar8 = sVar8 + uVar6;
    }
    if ((uVar4 & 2) != 0) {
      if (this->phase_ < 0) {
        uVar6 = 0xb;
      }
      else {
        uVar4 = this->phase_ | 1;
        iVar2 = 0x1f;
        if (uVar4 != 0) {
          for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
          }
        }
        uVar6 = (ulong)((iVar2 * 9 + 0x49U >> 6) + 1);
      }
      sVar8 = sVar8 + uVar6;
    }
  }
  this->_cached_size_ = (int)sVar8;
  return sVar8;
}

Assistant:

size_t NetState::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:caffe.NetState)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  // repeated string stage = 3;
  total_size += 1 *
      ::google::protobuf::internal::FromIntSize(this->stage_size());
  for (int i = 0, n = this->stage_size(); i < n; i++) {
    total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
      this->stage(i));
  }

  if (_has_bits_[0 / 32] & 3u) {
    // optional int32 level = 2 [default = 0];
    if (has_level()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->level());
    }

    // optional .caffe.Phase phase = 1 [default = TEST];
    if (has_phase()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::EnumSize(this->phase());
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}